

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

void __thiscall MTRand::save(MTRand *this,uint32 *saveArray)

{
  int local_2c;
  MTRand *pMStack_28;
  int i;
  uint32 *s;
  uint32 *sa;
  uint32 *saveArray_local;
  MTRand *this_local;
  
  local_2c = 0x270;
  pMStack_28 = this;
  s = saveArray;
  while (local_2c != 0) {
    *s = pMStack_28->state[0];
    local_2c = local_2c + -1;
    pMStack_28 = (MTRand *)(pMStack_28->state + 1);
    s = s + 1;
  }
  *s = (long)this->left;
  return;
}

Assistant:

void MTRand::save(uint32 *saveArray) const {
  uint32 *sa = saveArray;
  const uint32 *s = state;
  int i = N;
  for (; i--; *sa++ = *s++) {
  }
  *sa = left;
}